

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O3

void __thiscall QTreeWidgetItem::QTreeWidgetItem(QTreeWidgetItem *this,int type)

{
  QTreeWidgetItemPrivate *pQVar1;
  
  this->_vptr_QTreeWidgetItem = (_func_int **)&PTR__QTreeWidgetItem_00810850;
  this->rtti = type;
  (this->values).d.d = (Data *)0x0;
  (this->values).d.ptr = (QList<QWidgetItemData> *)0x0;
  (this->values).d.size = 0;
  this->view = (QTreeWidget *)0x0;
  pQVar1 = (QTreeWidgetItemPrivate *)operator_new(0x30);
  pQVar1->q = this;
  (pQVar1->display).d.d = (Data *)0x0;
  (pQVar1->display).d.ptr = (QVariant *)0x0;
  *(undefined8 *)((long)&(pQVar1->display).d.ptr + 1) = 0;
  *(undefined8 *)((long)&(pQVar1->display).d.size + 1) = 0;
  pQVar1->rowGuess = -1;
  pQVar1->policy = DontShowIndicatorWhenChildless;
  this->d = pQVar1;
  this->par = (QTreeWidgetItem *)0x0;
  (this->children).d.d = (Data *)0x0;
  (this->children).d.ptr = (QTreeWidgetItem **)0x0;
  (this->children).d.size = 0;
  (this->itemFlags).super_QFlagsStorageHelper<Qt::ItemFlag,_4>.super_QFlagsStorage<Qt::ItemFlag>.i =
       0x3d;
  return;
}

Assistant:

QTreeWidgetItem::QTreeWidgetItem(int type) : rtti(type), d(new QTreeWidgetItemPrivate(this)) { }